

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

void Aig_ManPartitionPrint(Aig_Man_t *p,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (vPartSuppsAll->nSize < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    do {
      if ((long)vPartsAll->nSize <= (long)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar1 = *(uint *)((long)vPartsAll->pArray[uVar3] + 4);
      printf("%d=(%d,%d) ",uVar3 & 0xffffffff,
             (ulong)*(uint *)((long)vPartSuppsAll->pArray[uVar3] + 4),(ulong)uVar1);
      iVar2 = iVar2 + uVar1;
    } while ((uVar3 != vPartsAll->nSize - 1) &&
            (uVar3 = uVar3 + 1, (long)uVar3 < (long)vPartSuppsAll->nSize));
  }
  if (iVar2 != p->nObjs[3]) {
    __assert_fail("Counter == Aig_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                  ,599,"void Aig_ManPartitionPrint(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  return;
}

Assistant:

void Aig_ManPartitionPrint( Aig_Man_t * p, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll )
{
    Vec_Int_t * vOne;
    int i, nOutputs, Counter;

    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        nOutputs = Vec_IntSize((Vec_Int_t *)Vec_PtrEntry(vPartsAll, i));
        printf( "%d=(%d,%d) ", i, Vec_IntSize(vOne), nOutputs );
        Counter += nOutputs;
        if ( i == Vec_PtrSize(vPartsAll) - 1 )
            break;
    }
    assert( Counter == Aig_ManCoNum(p) );
//    printf( "\nTotal = %d. Outputs = %d.\n", Counter, Aig_ManCoNum(p) );
}